

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

bool __thiscall
ON_UuidPairList::AddPair(ON_UuidPairList *this,ON_UUID id1,ON_UUID id2,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidPair *pOVar2;
  undefined3 in_register_00000089;
  ON_UUID_struct local_38;
  ON_UUID local_28;
  ON_UUID local_18;
  
  local_38.Data4 = id2.Data4;
  local_38._0_8_ = id2._0_8_;
  local_28.Data4 = id1.Data4;
  local_28._0_8_ = id1._0_8_;
  if (CONCAT31(in_register_00000089,bCheckForDupicates) == 0) {
LAB_003bce28:
    bVar1 = ::operator==(&ON_max_uuid,&local_28);
    if (bVar1) {
      bVar1 = ::operator==(&ON_max_uuid,&local_38);
      if (bVar1) goto LAB_003bce50;
    }
    pOVar2 = ON_SimpleArray<ON_UuidPair>::AppendNew(&this->super_ON_SimpleArray<ON_UuidPair>);
    pOVar2->m_uuid[0].Data1 = local_28.Data1;
    pOVar2->m_uuid[0].Data2 = local_28.Data2;
    pOVar2->m_uuid[0].Data3 = local_28.Data3;
    *&pOVar2->m_uuid[0].Data4 = local_28.Data4;
    pOVar2->m_uuid[1].Data1 = local_38.Data1;
    pOVar2->m_uuid[1].Data2 = local_38.Data2;
    pOVar2->m_uuid[1].Data3 = local_38.Data3;
    *&pOVar2->m_uuid[1].Data4 = local_38.Data4;
    bVar1 = true;
  }
  else {
    local_18._0_8_ = local_28._0_8_;
    local_18.Data4 = local_28.Data4;
    pOVar2 = SearchHelper(this,&local_18);
    if (pOVar2 == (ON_UuidPair *)0x0) goto LAB_003bce28;
LAB_003bce50:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_UuidPairList::AddPair(ON_UUID id1, ON_UUID id2, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindId1(id1,0) : true;
  if (rc)
  {
    if ( ON_max_uuid == id1 && ON_max_uuid == id2 )
    {
      // The value pair (ON_max_uuid,ON_max_uuid) is used
      // to mark removed elements.
      rc = false;
    }
    else
    {
      ON_UuidPair& ui = AppendNew();
      ui.m_uuid[0] = id1;
      ui.m_uuid[1] = id2;
    }
  }
  return rc;
}